

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_test.cc
# Opt level: O0

void __thiscall
ECDHTest_TestVectors_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,FileTest *t)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  char *pcVar3;
  pointer peVar4;
  pointer peVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  size_type sVar8;
  uchar *puVar9;
  char *in_R9;
  AssertHelper local_6e0;
  Message local_6d8;
  Span<const_unsigned_char> local_6d0;
  Bytes local_6c0;
  Span<const_unsigned_char> local_6b0;
  Bytes local_6a0;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_660;
  Message local_658;
  int local_64c;
  undefined1 local_648 [8];
  AssertionResult gtest_ar__16;
  uint8_t expected_digest [32];
  uint8_t digest [32];
  AssertHelper local_5f0;
  Message local_5e8;
  Bytes local_5e0;
  Bytes local_5d0;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_3;
  Message local_5a8;
  int local_59c;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_2;
  Message local_580;
  Bytes local_578;
  Span<const_unsigned_char> local_568;
  Bytes local_558;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_1;
  Message local_530;
  int local_524;
  undefined1 local_520 [8];
  AssertionResult gtest_ar;
  undefined1 local_508 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> actual_z;
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_488;
  Message local_480;
  int local_474;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_440;
  Message local_438;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3f8;
  Message local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_3b0;
  Message local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_368;
  Message local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_320;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__9;
  UniquePtr<EC_POINT> peer_pub_key;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<EC_POINT> pub_key;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<EC_KEY> key;
  AssertHelper local_248;
  Message local_240;
  allocator<char> local_231;
  string local_230;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> z;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<BIGNUM> peer_y;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<BIGNUM> peer_x;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<BIGNUM> y;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<BIGNUM> x;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIGNUM> priv_key;
  string local_70;
  AssertHelper local_50 [3];
  Message local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  EC_GROUP *group;
  FileTest *t_local;
  anon_class_1_0_00000001 *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )GetCurve(t,"Curve");
  testing::AssertionResult::AssertionResult<ec_group_st_const*>
            ((AssertionResult *)local_30,(ec_group_st **)&gtest_ar_.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_30,(AssertionResult *)0x8b1f08,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar2) {
    GetBIGNUM((FileTest *)&gtest_ar__1.message_,(char *)t);
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_90,
               (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar2) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&x,(internal *)local_90,(AssertionResult *)"priv_key","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                 ,0x4b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&x);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (bVar2) {
      GetBIGNUM((FileTest *)&gtest_ar__2.message_,(char *)t);
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d8,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0
                );
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar2) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&y,(internal *)local_d8,(AssertionResult *)0x89f0a1,"false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                   ,0x4d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)&y);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (bVar2) {
        GetBIGNUM((FileTest *)&gtest_ar__3.message_,(char *)t);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_120,
                   (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
        if (!bVar2) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&peer_x,(internal *)local_120,(AssertionResult *)0x8b2697,"false",
                     "true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                     ,0x4f,pcVar3);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&peer_x);
          testing::Message::~Message(&local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
        if (bVar2) {
          GetBIGNUM((FileTest *)&gtest_ar__4.message_,(char *)t);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_168,
                     (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
          if (!bVar2) {
            testing::Message::Message(&local_170);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&peer_y,(internal *)local_168,(AssertionResult *)"peer_x","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                       ,0x51,pcVar3);
            testing::internal::AssertHelper::operator=(&local_178,&local_170);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            std::__cxx11::string::~string((string *)&peer_y);
            testing::Message::~Message(&local_170);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
          if (bVar2) {
            GetBIGNUM((FileTest *)&gtest_ar__5.message_,(char *)t);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1b0,
                       (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar2) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &z.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1b0,
                         (AssertionResult *)"peer_y","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                         ,0x53,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string
                        ((string *)
                         &z.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::Message::~Message(&local_1b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
            if (bVar2) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &gtest_ar__6.message_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_230,"Z",&local_231);
              local_209 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&gtest_ar__6.message_,&local_230);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_208,&local_209,(type *)0x0);
              std::__cxx11::string::~string((string *)&local_230);
              std::allocator<char>::~allocator(&local_231);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
              if (!bVar2) {
                testing::Message::Message(&local_240);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&key,(internal *)local_208,
                           (AssertionResult *)"t->GetBytes(&z, \"Z\")","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_248,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                           ,0x55,pcVar3);
                testing::internal::AssertHelper::operator=(&local_248,&local_240);
                testing::internal::AssertHelper::~AssertHelper(&local_248);
                std::__cxx11::string::~string((string *)&key);
                testing::Message::~Message(&local_240);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
              if (bVar2) {
                peVar4 = (pointer)EC_KEY_new();
                std::unique_ptr<ec_key_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           peVar4);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_280,
                           (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           (type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_280);
                if (!bVar2) {
                  testing::Message::Message(&local_288);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&pub_key,(internal *)local_280,(AssertionResult *)0x8f28b1,
                             "false","true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_290,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                             ,0x58,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_290,&local_288);
                  testing::internal::AssertHelper::~AssertHelper(&local_290);
                  std::__cxx11::string::~string((string *)&pub_key);
                  testing::Message::~Message(&local_288);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                if (bVar2) {
                  peVar5 = (pointer)EC_POINT_new((EC_GROUP *)
                                                 gtest_ar_.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl);
                  std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)
                             &gtest_ar__8.message_,peVar5);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_2c8,
                             (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                             &gtest_ar__8.message_,(type *)0x0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2c8);
                  if (!bVar2) {
                    testing::Message::Message(&local_2d0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&peer_pub_key,(internal *)local_2c8,
                               (AssertionResult *)0x836750,"false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2d8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                               ,0x5a,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                    std::__cxx11::string::~string((string *)&peer_pub_key);
                    testing::Message::~Message(&local_2d0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
                  if (bVar2) {
                    peVar5 = (pointer)EC_POINT_new((EC_GROUP *)
                                                   gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                    std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
                    unique_ptr<bssl::internal::Deleter,void>
                              ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)
                               &gtest_ar__9.message_,peVar5);
                    testing::AssertionResult::
                    AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                              ((AssertionResult *)local_310,
                               (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_310);
                    if (!bVar2) {
                      testing::Message::Message(&local_318);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_310,
                                 (AssertionResult *)"peer_pub_key","false","true",in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_320,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                 ,0x5c,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_320,&local_318);
                      testing::internal::AssertHelper::~AssertHelper(&local_320);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_318);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
                    if (bVar2) {
                      peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      local_354 = EC_KEY_set_group((EC_KEY *)peVar4,
                                                   (EC_GROUP *)
                                                   gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_350,&local_354,(type *)0x0);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_350);
                      if (!bVar2) {
                        testing::Message::Message(&local_360);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__11.message_,(internal *)local_350,
                                   (AssertionResult *)"EC_KEY_set_group(key.get(), group)","false",
                                   "true",in_R9);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_368,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                   ,0x5d,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_368,&local_360);
                        testing::internal::AssertHelper::~AssertHelper(&local_368);
                        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                        testing::Message::~Message(&local_360);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                      if (bVar2) {
                        peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__7.message_);
                        pBVar6 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__1.message_);
                        local_39c = EC_KEY_set_private_key((EC_KEY *)peVar4,pBVar6);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_398,&local_39c,(type *)0x0);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_398);
                        if (!bVar2) {
                          testing::Message::Message(&local_3a8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__12.message_,(internal *)local_398,
                                     (AssertionResult *)
                                     "EC_KEY_set_private_key(key.get(), priv_key.get())","false",
                                     "true",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3b0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                     ,0x5e,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
                          testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                          testing::Message::~Message(&local_3a8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
                        uVar1 = gtest_ar_.message_;
                        if (bVar2) {
                          peVar5 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__8.message_);
                          pBVar6 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__2.message_);
                          pBVar7 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__3.message_);
                          local_3e4 = EC_POINT_set_affine_coordinates_GFp
                                                ((EC_GROUP *)
                                                 uVar1._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl,(EC_POINT *)peVar5,pBVar6,pBVar7,
                                                 (BN_CTX *)0x0);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_3e0,&local_3e4,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3e0);
                          if (!bVar2) {
                            testing::Message::Message(&local_3f0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__13.message_,(internal *)local_3e0,
                                       (AssertionResult *)
                                       "EC_POINT_set_affine_coordinates_GFp(group, pub_key.get(), x.get(), y.get(), nullptr)"
                                       ,"false","true",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                       ,0x60,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
                            testing::internal::AssertHelper::~AssertHelper(&local_3f8);
                            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                            testing::Message::~Message(&local_3f0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
                          uVar1 = gtest_ar_.message_;
                          if (bVar2) {
                            peVar5 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__9.message_);
                            pBVar6 = (BIGNUM *)
                                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__4.message_);
                            pBVar7 = (BIGNUM *)
                                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__5.message_);
                            local_42c = EC_POINT_set_affine_coordinates_GFp
                                                  ((EC_GROUP *)
                                                   uVar1._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(EC_POINT *)peVar5,pBVar6,pBVar7,
                                                  (BN_CTX *)0x0);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_428,&local_42c,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_428);
                            if (!bVar2) {
                              testing::Message::Message(&local_438);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__14.message_,(internal *)local_428,
                                         (AssertionResult *)
                                         "EC_POINT_set_affine_coordinates_GFp( group, peer_pub_key.get(), peer_x.get(), peer_y.get(), nullptr)"
                                         ,"false","true",in_R9);
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_440,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                         ,0x62,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_440,&local_438);
                              testing::internal::AssertHelper::~AssertHelper(&local_440);
                              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                              testing::Message::~Message(&local_438);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_428)
                            ;
                            if (bVar2) {
                              peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__7.message_);
                              peVar5 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ec_point_st,_bssl::internal::Deleter>
                                                   *)&gtest_ar__8.message_);
                              local_474 = EC_KEY_set_public_key((EC_KEY *)peVar4,(EC_POINT *)peVar5)
                              ;
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_470,&local_474,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_470);
                              if (!bVar2) {
                                testing::Message::Message(&local_480);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__15.message_,(internal *)local_470,
                                           (AssertionResult *)
                                           "EC_KEY_set_public_key(key.get(), pub_key.get())","false"
                                           ,"true",in_R9);
                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_488,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                           ,99,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_488,&local_480);
                                testing::internal::AssertHelper::~AssertHelper(&local_488);
                                std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                                testing::Message::~Message(&local_480);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_470);
                              if (bVar2) {
                                peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                   ((unique_ptr<ec_key_st,_bssl::internal::Deleter>
                                                     *)&gtest_ar__7.message_);
                                local_4bc = EC_KEY_check_key((EC_KEY *)peVar4);
                                testing::AssertionResult::AssertionResult<int>
                                          ((AssertionResult *)local_4b8,&local_4bc,(type *)0x0);
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_4b8);
                                if (!bVar2) {
                                  testing::Message::Message(&local_4c8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &actual_z.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             (internal *)local_4b8,
                                             (AssertionResult *)"EC_KEY_check_key(key.get())",
                                             "false","true",in_R9);
                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_4d0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                             ,100,pcVar3);
                                  testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_4d0);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &actual_z.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                  testing::Message::~Message(&local_4c8);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_4b8);
                                if (bVar2) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)local_508);
                                  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::size((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__6.message_);
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)local_508,sVar8 + 1);
                                  puVar9 = std::
                                           vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                           data((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)local_508);
                                  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::size((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)local_508);
                                  peVar5 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::
                                           get((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__9.message_);
                                  peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                                     ((
                                                  unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__7.message_);
                                  gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ =
                                       ECDH_compute_key(puVar9,sVar8,(EC_POINT *)peVar5,
                                                        (EC_KEY *)peVar4,(KDF *)0x0);
                                  local_524 = 0;
                                  testing::internal::CmpHelperGE<int,int>
                                            ((internal *)local_520,"ret","0",
                                             (int *)((long)&gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),&local_524);
                                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_520);
                                  if (!bVar2) {
                                    testing::Message::Message(&local_530);
                                    pcVar3 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_520);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                               ,0x6c,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_1.message_,&local_530);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_1.message_);
                                    testing::Message::~Message(&local_530);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_520);
                                  if (bVar2) {
                                    bssl::Span<unsigned_char_const>::
                                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                              ((Span<unsigned_char_const> *)&local_568,
                                               (vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&gtest_ar__6.message_);
                                    Bytes::Bytes(&local_558,local_568);
                                    puVar9 = std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             data((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)local_508);
                                    Bytes::Bytes(&local_578,puVar9,
                                                 (long)gtest_ar.message_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_);
                                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                              ((EqHelper *)local_548,"Bytes(z)",
                                               "Bytes(actual_z.data(), static_cast<size_t>(ret))",
                                               &local_558,&local_578);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_548);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_580);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_548);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_2.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                                 ,0x6d,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_2.message_,&local_580);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_2.message_);
                                      testing::Message::~Message(&local_580);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_548);
                                    sVar8 = std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            size((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__6.message_);
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_508,sVar8 - 1);
                                    puVar9 = std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             data((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)local_508);
                                    sVar8 = std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            size((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)local_508);
                                    peVar5 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::
                                             get((unique_ptr<ec_point_st,_bssl::internal::Deleter> *
                                                 )&gtest_ar__9.message_);
                                    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::
                                             get((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__7.message_);
                                    gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ =
                                         ECDH_compute_key(puVar9,sVar8,(EC_POINT *)peVar5,
                                                          (EC_KEY *)peVar4,(KDF *)0x0);
                                    local_59c = 0;
                                    testing::internal::CmpHelperGE<int,int>
                                              ((internal *)local_598,"ret","0",
                                               (int *)((long)&gtest_ar.message_._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),&local_59c);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_598);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_5a8);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_598);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                                 ,0x73,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_3.message_,&local_5a8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_3.message_);
                                      testing::Message::~Message(&local_5a8);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_598);
                                    if (bVar2) {
                                      puVar9 = std::
                                               vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               ::data((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__6.message_);
                                      sVar8 = std::
                                              vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              ::size((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__6.message_);
                                      Bytes::Bytes(&local_5d0,puVar9,sVar8 - 1);
                                      puVar9 = std::
                                               vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               ::data((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)local_508);
                                      Bytes::Bytes(&local_5e0,puVar9,
                                                   (long)gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_);
                                      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                                ((EqHelper *)local_5c0,
                                                 "Bytes(z.data(), z.size() - 1)",
                                                 "Bytes(actual_z.data(), static_cast<size_t>(ret))",
                                                 &local_5d0,&local_5e0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_5c0);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_5e8);
                                        pcVar3 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_5c0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_5f0,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                                  ,0x75,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_5f0,&local_5e8);
                                        testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                                        testing::Message::~Message(&local_5e8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_5c0);
                                      peVar5 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>
                                               ::get((
                                                  unique_ptr<ec_point_st,_bssl::internal::Deleter> *
                                                  )&gtest_ar__9.message_);
                                      peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::
                                               get((unique_ptr<ec_key_st,_bssl::internal::Deleter> *
                                                   )&gtest_ar__7.message_);
                                      local_64c = ECDH_compute_key_fips
                                                            (expected_digest + 0x18,0x20,peVar5,
                                                             peVar4);
                                      testing::AssertionResult::AssertionResult<int>
                                                ((AssertionResult *)local_648,&local_64c,(type *)0x0
                                                );
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_648);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_658);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)&gtest_ar_4.message_,
                                                   (internal *)local_648,
                                                   (AssertionResult *)
                                                                                                      
                                                  "ECDH_compute_key_fips(digest, sizeof(digest), peer_pub_key.get(), key.get())"
                                                  ,"false","true",in_R9);
                                        pcVar3 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_660,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                                  ,0x7a,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_660,&local_658);
                                        testing::internal::AssertHelper::~AssertHelper(&local_660);
                                        std::__cxx11::string::~string
                                                  ((string *)&gtest_ar_4.message_);
                                        testing::Message::~Message(&local_658);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_648);
                                      if (bVar2) {
                                        puVar9 = std::
                                                 vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ::data((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__6.message_);
                                        sVar8 = std::
                                                vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                ::size((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__6.message_);
                                        SHA256(puVar9,sVar8,(uchar *)&gtest_ar__16.message_);
                                        bssl::Span<unsigned_char_const>::Span<32ul>
                                                  ((Span<unsigned_char_const> *)&local_6b0,
                                                   (uchar (*) [32])(expected_digest + 0x18));
                                        Bytes::Bytes(&local_6a0,local_6b0);
                                        bssl::Span<unsigned_char_const>::Span<32ul>
                                                  ((Span<unsigned_char_const> *)&local_6d0,
                                                   (uchar (*) [32])&gtest_ar__16.message_);
                                        Bytes::Bytes(&local_6c0,local_6d0);
                                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                                  ((EqHelper *)local_690,"Bytes(digest)",
                                                   "Bytes(expected_digest)",&local_6a0,&local_6c0);
                                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_690);
                                        if (!bVar2) {
                                          testing::Message::Message(&local_6d8);
                                          pcVar3 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_690);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_6e0,kNonFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh_test.cc"
                                                  ,0x7c,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_6e0,&local_6d8);
                                          testing::internal::AssertHelper::~AssertHelper(&local_6e0)
                                          ;
                                          testing::Message::~Message(&local_6d8);
                                        }
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_690);
                                      }
                                    }
                                  }
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  ~vector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          local_508);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_);
                  }
                  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                             &gtest_ar__8.message_);
                }
                std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_);
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &gtest_ar__6.message_);
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  return;
}

Assistant:

TEST(ECDHTest, TestVectors) {
  FileTestGTest("crypto/ecdh/ecdh_tests.txt", [](FileTest *t) {
    const EC_GROUP *group = GetCurve(t, "Curve");
    ASSERT_TRUE(group);
    bssl::UniquePtr<BIGNUM> priv_key = GetBIGNUM(t, "Private");
    ASSERT_TRUE(priv_key);
    bssl::UniquePtr<BIGNUM> x = GetBIGNUM(t, "X");
    ASSERT_TRUE(x);
    bssl::UniquePtr<BIGNUM> y = GetBIGNUM(t, "Y");
    ASSERT_TRUE(y);
    bssl::UniquePtr<BIGNUM> peer_x = GetBIGNUM(t, "PeerX");
    ASSERT_TRUE(peer_x);
    bssl::UniquePtr<BIGNUM> peer_y = GetBIGNUM(t, "PeerY");
    ASSERT_TRUE(peer_y);
    std::vector<uint8_t> z;
    ASSERT_TRUE(t->GetBytes(&z, "Z"));

    bssl::UniquePtr<EC_KEY> key(EC_KEY_new());
    ASSERT_TRUE(key);
    bssl::UniquePtr<EC_POINT> pub_key(EC_POINT_new(group));
    ASSERT_TRUE(pub_key);
    bssl::UniquePtr<EC_POINT> peer_pub_key(EC_POINT_new(group));
    ASSERT_TRUE(peer_pub_key);
    ASSERT_TRUE(EC_KEY_set_group(key.get(), group));
    ASSERT_TRUE(EC_KEY_set_private_key(key.get(), priv_key.get()));
    ASSERT_TRUE(EC_POINT_set_affine_coordinates_GFp(group, pub_key.get(),
                                                    x.get(), y.get(), nullptr));
    ASSERT_TRUE(EC_POINT_set_affine_coordinates_GFp(
        group, peer_pub_key.get(), peer_x.get(), peer_y.get(), nullptr));
    ASSERT_TRUE(EC_KEY_set_public_key(key.get(), pub_key.get()));
    ASSERT_TRUE(EC_KEY_check_key(key.get()));

    std::vector<uint8_t> actual_z;
    // Make |actual_z| larger than expected to ensure |ECDH_compute_key| returns
    // the right amount of data.
    actual_z.resize(z.size() + 1);
    int ret = ECDH_compute_key(actual_z.data(), actual_z.size(),
                               peer_pub_key.get(), key.get(), nullptr);
    ASSERT_GE(ret, 0);
    EXPECT_EQ(Bytes(z), Bytes(actual_z.data(), static_cast<size_t>(ret)));

    // Test |ECDH_compute_key| truncates.
    actual_z.resize(z.size() - 1);
    ret = ECDH_compute_key(actual_z.data(), actual_z.size(), peer_pub_key.get(),
                           key.get(), nullptr);
    ASSERT_GE(ret, 0);
    EXPECT_EQ(Bytes(z.data(), z.size() - 1),
              Bytes(actual_z.data(), static_cast<size_t>(ret)));

    // Test that |ECDH_compute_key_fips| hashes as expected.
    uint8_t digest[SHA256_DIGEST_LENGTH], expected_digest[SHA256_DIGEST_LENGTH];
    ASSERT_TRUE(ECDH_compute_key_fips(digest, sizeof(digest),
                                      peer_pub_key.get(), key.get()));
    SHA256(z.data(), z.size(), expected_digest);
    EXPECT_EQ(Bytes(digest), Bytes(expected_digest));
  });
}